

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O2

int Pla_ReadPlaHeader(char *pBuffer,char *pLimit,int *pnIns,int *pnOuts,int *pnCubes,int *pType)

{
  char *__s1;
  int iVar1;
  int iVar2;
  uint uVar3;
  char *__nptr;
  char Buffer [100];
  
  *pType = 0;
  *pnCubes = -1;
  *pnOuts = -1;
  *pnIns = -1;
  for (__nptr = pBuffer + 3; __s1 = __nptr + -3, __s1 < pLimit; __nptr = __nptr + 1) {
    if (*__s1 == '.') {
      if ((__nptr[-2] == 'i') && (__nptr[-1] == ' ')) {
        iVar1 = atoi(__nptr);
        *pnIns = iVar1;
      }
      else if ((__nptr[-2] == 'o') && (__nptr[-1] == ' ')) {
        iVar1 = atoi(__nptr);
        *pnOuts = iVar1;
      }
      else if ((__nptr[-2] == 'p') && (__nptr[-1] == ' ')) {
        iVar1 = atoi(__nptr);
        *pnCubes = iVar1;
      }
      else {
        if ((__nptr[-2] == 'e') && (__nptr[-1] == ' ')) break;
        iVar1 = strncmp(__s1,".type ",6);
        if (iVar1 == 0) {
          *pType = 4;
          __isoc99_sscanf(__nptr + 3,"%s",Buffer);
          iVar1 = 1;
          if (Buffer._0_2_ != 0x66) {
            iVar2 = bcmp(Buffer,"fr",3);
            iVar1 = 2;
            if (iVar2 != 0) {
              iVar1 = bcmp(Buffer,"fd",3);
              if (iVar1 == 0) {
                iVar1 = 0;
              }
              else {
                iVar1 = 3;
                if (Buffer._0_4_ != 0x726466) goto LAB_002f8d56;
              }
            }
          }
          *pType = iVar1;
        }
      }
    }
LAB_002f8d56:
  }
  if (*pnIns < 1) {
    puts("The number of inputs (.i) should be positive.");
  }
  if (*pnOuts < 1) {
    puts("The number of outputs (.o) should be positive.");
  }
  if (*pnIns < 1) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(0 < *pnOuts);
  }
  return uVar3;
}

Assistant:

int Pla_ReadPlaHeader( char * pBuffer, char * pLimit, int * pnIns, int * pnOuts, int * pnCubes, int * pType )
{
    char * pTemp; 
    *pType = PLA_FILE_FD;
    *pnIns = *pnOuts = *pnCubes = -1;
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp != '.' )
            continue;
        if ( !strncmp(pTemp, ".i ", 3) )
            *pnIns = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".o ", 3) )
            *pnOuts = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".p ", 3) )
            *pnCubes = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".e ", 3) )
            break;
        else if ( !strncmp(pTemp, ".type ", 6) )
        {
            char Buffer[100];
            *pType = PLA_FILE_NONE;
            sscanf( pTemp+6, "%s", Buffer );
            if ( !strcmp(Buffer, "f") )
                *pType = PLA_FILE_F;
            else if ( !strcmp(Buffer, "fr") )
                *pType = PLA_FILE_FR;
            else if ( !strcmp(Buffer, "fd") )
                *pType = PLA_FILE_FD;
            else if ( !strcmp(Buffer, "fdr") )
                *pType = PLA_FILE_FDR;
        }
    }
    if ( *pnIns <= 0 )
        printf( "The number of inputs (.i) should be positive.\n" );
    if ( *pnOuts <= 0 )
        printf( "The number of outputs (.o) should be positive.\n" );
    return *pnIns > 0 && *pnOuts > 0;
}